

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O1

void track_attack(CHAR_DATA *mob,CHAR_DATA *victim)

{
  bool bVar1;
  char *pcVar2;
  char buf [4608];
  char acStack_1218 [4616];
  
  if (mob->in_room != victim->in_room) {
    return;
  }
  bVar1 = can_see(mob,victim);
  if ((bVar1) && (mob->fighting == (CHAR_DATA *)0x0)) {
    bVar1 = is_affected_by(mob,0x1e);
    if (!bVar1) {
      pcVar2 = mob->pIndexData->attack_yell;
      if (pcVar2 == (char *)0x0) {
        sprintf(acStack_1218,"%s, now you die!",victim->name);
      }
      else {
        pcVar2 = act_msg(pcVar2,victim);
        strcpy(acStack_1218,pcVar2);
      }
      do_yell(mob,acStack_1218);
      multi_hit(mob,victim,-1);
    }
  }
  return;
}

Assistant:

void track_attack(CHAR_DATA *mob, CHAR_DATA *victim)
{
	char buf[MSL];
	if (mob->in_room != victim->in_room || !can_see(mob, victim) || mob->fighting || is_affected_by(mob, AFF_NOSHOW))
		return;

	if (mob->pIndexData->attack_yell)
		sprintf(buf, "%s", act_msg(mob->pIndexData->attack_yell, victim));
	else
		sprintf(buf, "%s, now you die!", victim->name);

	do_yell(mob, buf);
	multi_hit(mob, victim, TYPE_UNDEFINED);
}